

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-fds.c
# Opt level: O3

void delete_from_fdwsi(lws_context *context,lws *wsi)

{
  lws *plVar1;
  long lVar2;
  
  if (((context->field_0x7b8 & 4) != 0) && ((ulong)context->max_fds != 0)) {
    lVar2 = 0;
    do {
      plVar1 = *(lws **)((long)context->lws_lookup + lVar2);
      if (plVar1 != (lws *)0x0 && plVar1 == wsi) {
        *(undefined8 *)((long)context->lws_lookup + lVar2) = 0;
        return;
      }
      lVar2 = lVar2 + 8;
    } while ((ulong)context->max_fds << 3 != lVar2);
  }
  return;
}

Assistant:

void
delete_from_fdwsi(const struct lws_context *context, struct lws *wsi)
{

	struct lws **p, **done;

	if (!context->max_fds_unrelated_to_ulimit)
		return;


	/* slow fds handling */

	p = context->lws_lookup;
	done = &p[context->max_fds];

	/* find the match */

	while (p != done && (!*p || (*p) != wsi))
		p++;

	if (p != done)
		*p = NULL;
}